

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pyraminx.cpp
# Opt level: O0

void __thiscall Pyraminx::print(Pyraminx *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  element_type *peVar4;
  int local_44;
  int local_40;
  int j_3;
  int entry_3;
  int j_2;
  int row_len;
  int layer_1;
  int j_1;
  int entry_2;
  int entry_1;
  int entry;
  int j;
  int bottom_row_len;
  int top_row_len;
  int layer;
  Pyraminx *this_local;
  
  for (bottom_row_len = 0; bottom_row_len < 4; bottom_row_len = bottom_row_len + 1) {
    iVar1 = bottom_row_len * 2 + 1;
    iVar3 = -iVar1;
    iVar2 = iVar3 + 8;
    for (entry_1 = 0; entry_1 < (7 - iVar2) / 2; entry_1 = entry_1 + 1) {
      printf(" ");
    }
    for (entry_2 = 0; entry_2 < iVar2; entry_2 = entry_2 + 1) {
      peVar4 = std::__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &this->red_face);
      Face::print_triangle(peVar4,L,3 - bottom_row_len,(iVar3 + 7) - entry_2);
    }
    printf(" ");
    for (j_1 = 0; j_1 < iVar1; j_1 = j_1 + 1) {
      peVar4 = std::__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &this->blue_face);
      Face::print_triangle(peVar4,U,bottom_row_len,j_1);
    }
    printf(" ");
    for (layer_1 = 0; layer_1 < iVar2; layer_1 = layer_1 + 1) {
      peVar4 = std::__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &this->yellow_face);
      Face::print_triangle(peVar4,R,3 - bottom_row_len,(iVar3 + 7) - layer_1);
    }
    for (row_len = 0; row_len < (7 - iVar2) / 2; row_len = row_len + 1) {
      printf(" ");
    }
    printf("\n");
  }
  for (j_2 = 3; -1 < j_2; j_2 = j_2 + -1) {
    local_40 = j_2 * 2;
    iVar3 = local_40 + 1;
    printf("     ");
    for (j_3 = 0; j_3 < (7 - iVar3) / 2; j_3 = j_3 + 1) {
      printf(" ");
    }
    for (; -1 < local_40; local_40 = local_40 + -1) {
      peVar4 = std::__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &this->green_face);
      Face::print_triangle(peVar4,B,j_2,local_40);
    }
    for (local_44 = 0; local_44 < (7 - iVar3) / 2; local_44 = local_44 + 1) {
      printf(" ");
    }
    printf("\n");
  }
  return;
}

Assistant:

void Pyraminx::print(){
    for(int layer = 0; layer < 4; layer++){
        int top_row_len = 2*layer +1;
        int bottom_row_len = (7- top_row_len) + 1;
        for(int j = 0; j < (7-bottom_row_len)/2; j++){
            printf(" ");
        }
        for(int entry = 0; entry < bottom_row_len; entry++){
            red_face->print_triangle(Corner::L, 3-layer, (bottom_row_len - 1) - entry);
        }
        printf(" ");
        for(int entry = 0; entry < top_row_len; entry++){
            blue_face->print_triangle(Corner::U, layer, entry);
        }
        printf(" ");
        for(int entry = 0; entry < bottom_row_len; entry++){
            yellow_face->print_triangle(Corner::R, 3-layer, (bottom_row_len - 1) - entry);
        }
        for(int j = 0; j < (7-bottom_row_len)/2; j++){
                printf(" ");
        }
        printf("\n");
    }
    for(int layer = 3; layer >=0; layer--){
        int row_len = layer*2 + 1;
        printf("     "); // Offset so green appears below blue
        for(int j = 0; j < (7 - row_len)/2; j++){
                printf(" ");
        }
        for(int entry = row_len - 1; entry >= 0; entry--){
            green_face->print_triangle(Corner::B, layer, entry);
        }
        for(int j = 0; j < (7 - row_len)/2; j++){
                printf(" ");
        }
        printf("\n");
    }
}